

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

void read_utf8(charset_spec *charset,long input_chr,charset_state *state,
              _func_void_void_ptr_long *emit,void *emitctx)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  unsigned_long uVar6;
  uint uVar7;
  
  if (input_chr < 0x80) {
    if (state->s0 != 0) {
      (*emit)(emitctx,0xffff);
      state->s0 = 0;
    }
  }
  else {
    if ((input_chr & 0x7ffffffffffffffeU) == 0xfe) {
      if (state->s0 != 0) {
        (*emit)(emitctx,0xffff);
        state->s0 = 0;
      }
    }
    else {
      uVar6 = state->s0;
      uVar5 = (uint)input_chr;
      if (0xbf < (ulong)input_chr) {
        if (uVar6 != 0) {
          (*emit)(emitctx,0xffff);
        }
        if ((ulong)input_chr < 0xe0) {
          uVar6 = (ulong)(uVar5 & 0x1f) | 0x44000000;
        }
        else {
          if (0xef < (ulong)input_chr) {
            if ((ulong)input_chr < 0xf8) {
              uVar3 = (ulong)(uVar5 & 7) | 0x84000000;
            }
            else if ((ulong)input_chr < 0xfc) {
              uVar3 = (ulong)(uVar5 & 3) + 0xa4000000;
            }
            else {
              if (0xfd < (ulong)input_chr) {
                return;
              }
              uVar3 = (ulong)(uVar5 & 1) + 0xc4000000;
            }
            state->s0 = uVar3;
            return;
          }
          uVar6 = (ulong)(uVar5 & 0xf) | 0x64000000;
        }
LAB_00115b0c:
        state->s0 = uVar6;
        return;
      }
      if (uVar6 != 0) {
        uVar4 = (uint)uVar6;
        uVar2 = uVar4 << 6;
        input_chr = (long)(uVar5 & 0x3f | uVar2);
        uVar7 = uVar4 & 0xfc000000;
        uVar3 = (ulong)uVar7 + 0x4000000;
        uVar1 = (uint)uVar3;
        if (((uVar1 * 8 ^ uVar1) & 0xe0000000) != 0) {
          uVar6 = input_chr | uVar3;
          goto LAB_00115b0c;
        }
        state->s0 = 0;
        if (((((uVar4 & 0x3ffffe0) != 0x360) && ((uVar5 & 0x3e | uVar2) != 0xfffe)) &&
            (0x7f < uVar2)) &&
           (((uVar7 < 0x5c000000 || 0x7ff < uVar2 && (uVar7 < 0x7c000000 || 0xffff < uVar2)) &&
            ((uVar7 < 0x9c000000 || 0x1fffff < uVar2 &&
             ((ulong)uVar7 < 0xbc000000 || 0x3ffffff < uVar2)))))) goto LAB_00115bd3;
      }
    }
    input_chr = 0xffff;
  }
LAB_00115bd3:
  (*emit)(emitctx,input_chr);
  return;
}

Assistant:

static void read_utf8(charset_spec const *charset, long int input_chr,
                      charset_state *state,
                      void (*emit)(void *ctx, long int output), void *emitctx)
{
    UNUSEDARG(charset);

    /*
     * For reading UTF-8, the `state' word contains:
     *
     *  - in bits 29-31, the number of bytes expected to be in the
     *    current multibyte character (which we can tell instantly
     *    from the first byte, of course).
     *
     *  - in bits 26-28, the number of bytes _seen so far_ in the
     *    current multibyte character.
     *
     *  - in the remainder of the word, the current value of the
     *    character, which is shifted upwards by 6 bits to
     *    accommodate each new byte.
     *
     * As required, the state is zero when we are not in the middle
     * of a multibyte character at all.
     *
     * For example, when reading E9 8D 8B, starting at state=0:
     *
     *  - after E9, the state is 0x64000009
     *  - after 8D, the state is 0x6800024d
     *  - after 8B, the state conceptually becomes 0x6c00934b, at
     *    which point we notice we've got as many characters as we
     *    were expecting, output U+934B, and reset the state to
     *    zero.
     *
     * Note that the maximum number of bits we might need to store
     * in the character value field is 25 (U+7FFFFFFF contains 31
     * bits, but we will never actually store its full value
     * because when we receive the last 6 bits in the final
     * continuation byte we will output it and revert the state to
     * zero). Hence the character value field never collides with
     * the byte counts.
     */

    if (input_chr < 0x80) {
        /*
         * Single-byte character. If the state is nonzero before
         * coming here, output an error for an incomplete sequence.
         * Then output the character.
         */
        if (state->s0 != 0) {
            emit(emitctx, ERROR);
            state->s0 = 0;
        }
        emit(emitctx, input_chr);
    } else if (input_chr == 0xFE || input_chr == 0xFF) {
        /*
         * FE and FF bytes should _never_ occur in UTF-8. They are
         * automatic errors; if the state was nonzero to start
         * with, output a further error for an incomplete sequence.
         */
        if (state->s0 != 0) {
            emit(emitctx, ERROR);
            state->s0 = 0;
        }
        emit(emitctx, ERROR);
    } else if (input_chr >= 0x80 && input_chr < 0xC0) {
        /*
         * Continuation byte. Output an error for an unexpected
         * continuation byte, if the state is zero.
         */
        if (state->s0 == 0) {
            emit(emitctx, ERROR);
        } else {
            unsigned long charval;
            unsigned long topstuff;
            int bytes;

            /*
             * Otherwise, accumulate more of the character value.
             */
            charval = state->s0 & 0x03ffffffL;
            charval = (charval << 6) | (input_chr & 0x3F);

            /*
             * Check the byte counts; if we have not reached the
             * end of the character, update the state and return.
             */
            topstuff = state->s0 & 0xfc000000L;
            topstuff += 0x04000000L;   /* add one to the byte count */
            if (((topstuff << 3) ^ topstuff) & 0xe0000000L) {
                state->s0 = topstuff | charval;
                return;
            }

            /*
             * Now we know we've reached the end of the character.
             * `charval' is the Unicode value. We should check for
             * various invalid things, and then either output
             * charval or an error. In all cases we reset the state
             * to zero.
             */
            bytes = topstuff >> 29;
            state->s0 = 0;

            if (charval >= 0xD800 && charval < 0xE000) {
                /*
                 * Surrogates (0xD800-0xDFFF) may never be encoded
                 * in UTF-8. A surrogate pair in Unicode should
                 * have been encoded as a single UTF-8 character
                 * occupying more than three bytes.
                 */
                emit(emitctx, ERROR);
            } else if (charval == 0xFFFE || charval == 0xFFFF) {
                /*
                 * U+FFFE and U+FFFF are invalid Unicode characters
                 * and may never be encoded in UTF-8. (This is one
                 * reason why U+FFFF is our way of signalling an
                 * error to our `emit' function :-)
                 */
                emit(emitctx, ERROR);
            } else if ((charval <= 0x7FL /* && bytes > 1 */) ||
                       (charval <= 0x7FFL && bytes > 2) ||
                       (charval <= 0xFFFFL && bytes > 3) ||
                       (charval <= 0x1FFFFFL && bytes > 4) ||
                       (charval <= 0x3FFFFFFL && bytes > 5)) {
                /*
                 * Overlong sequences are not to be tolerated,
                 * under any circumstances.
                 */
                emit(emitctx, ERROR);
            } else {
                /*
                 * Oh, all right. We'll let this one off.
                 */
                emit(emitctx, charval);
            }
        }

    } else {
        /*
         * Lead byte. First output an error for an incomplete
         * sequence, if the state is nonzero.
         */
        if (state->s0 != 0)
            emit(emitctx, ERROR);

        /*
         * Now deal with the lead byte: work out the number of
         * bytes we expect to see in this character, and extract
         * the initial bits of it too.
         */
        if (input_chr >= 0xC0 && input_chr < 0xE0) {
            state->s0 = 0x44000000L | (input_chr & 0x1F);
        } else if (input_chr >= 0xE0 && input_chr < 0xF0) {
            state->s0 = 0x64000000L | (input_chr & 0x0F);
        } else if (input_chr >= 0xF0 && input_chr < 0xF8) {
            state->s0 = 0x84000000L | (input_chr & 0x07);
        } else if (input_chr >= 0xF8 && input_chr < 0xFC) {
            state->s0 = 0xa4000000L | (input_chr & 0x03);
        } else if (input_chr >= 0xFC && input_chr < 0xFE) {
            state->s0 = 0xc4000000L | (input_chr & 0x01);
        }
    }
}